

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_simd.cpp
# Opt level: O2

void multikey_simd_b<unsigned_short>
               (uchar **strings,size_t N,size_t depth,uchar **sorted,uint8_t *oracle)

{
  uchar *puVar1;
  value_type_conflict vVar2;
  unsigned_long N_00;
  uchar **sorted_00;
  size_t sVar3;
  uint8_t *oracle_00;
  unsigned_short uVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint j;
  undefined6 extraout_var;
  long lVar13;
  undefined6 extraout_var_00;
  ulong uVar14;
  size_t i;
  ulong uVar15;
  undefined1 uVar16;
  char cVar19;
  undefined1 uVar20;
  char cVar21;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  array<unsigned_long,_3UL> bucketsize;
  size_t bucketindex [3];
  char local_b8;
  array<unsigned_long,_3UL> local_b0;
  undefined8 local_98;
  undefined8 uStack_90;
  value_type_conflict local_88;
  size_t local_80;
  long local_78;
  uchar **local_68;
  ulong local_60;
  size_t local_58;
  uint8_t *local_50;
  undefined2 local_48;
  undefined2 uStack_46;
  undefined2 uStack_44;
  undefined2 uStack_42;
  undefined2 uStack_40;
  undefined2 uStack_3e;
  undefined2 uStack_3c;
  undefined2 uStack_3a;
  
  if (N < 0x20) {
    insertion_sort(strings,(int)N,depth);
    return;
  }
  local_68 = sorted;
  uVar4 = pseudo_median<unsigned_short>(strings,N,depth);
  local_88 = 0;
  std::array<unsigned_long,_3UL>::fill(&local_b0,&local_88);
  auVar17 = ZEXT416((uint)CONCAT62(extraout_var,uVar4));
  auVar17 = pshuflw(auVar17,auVar17,0);
  uVar16 = auVar17[0];
  cVar19 = auVar17[1];
  uVar20 = auVar17[2];
  cVar21 = auVar17[3];
  local_48 = CONCAT11(cVar19 + -0x80,uVar16);
  uStack_46 = CONCAT11(cVar21 + -0x80,uVar20);
  uStack_44 = CONCAT11(cVar19 + -0x80,uVar16);
  uStack_42 = CONCAT11(cVar21 + -0x80,uVar20);
  uStack_40 = CONCAT11(cVar19 + -0x80,uVar16);
  uStack_3e = CONCAT11(cVar21 + -0x80,uVar20);
  uStack_3c = CONCAT11(cVar19 + -0x80,uVar16);
  uStack_3a = CONCAT11(cVar21 + -0x80,uVar20);
  local_50 = oracle;
  local_58 = N;
  local_60 = N & 0xfffffffffffffff0;
  for (uVar15 = 0; oracle_00 = local_50, sVar3 = local_58, sorted_00 = local_68, uVar14 = local_60,
      uVar15 < local_60; uVar15 = uVar15 + 0x10) {
    for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
    }
    uVar5 = get_char<unsigned_short>(strings[uVar15],depth);
    local_98 = CONCAT44(local_98._4_4_,(int)CONCAT62(extraout_var_00,uVar5));
    uVar5 = get_char<unsigned_short>(strings[uVar15 + 2],depth);
    uVar6 = get_char<unsigned_short>(strings[uVar15 + 4],depth);
    uVar7 = get_char<unsigned_short>(strings[uVar15 + 6],depth);
    uVar8 = get_char<unsigned_short>(strings[uVar15 + 8],depth);
    uVar9 = get_char<unsigned_short>(strings[uVar15 + 10],depth);
    uVar10 = get_char<unsigned_short>(strings[uVar15 + 0xc],depth);
    uVar11 = get_char<unsigned_short>(strings[uVar15 + 0xe],depth);
    local_98 = CONCAT44(CONCAT22(uVar7,uVar6),CONCAT22(uVar5,(short)local_98));
    uStack_90 = CONCAT44(CONCAT22(uVar11,uVar10),CONCAT22(uVar9,uVar8));
    uVar5 = get_char<unsigned_short>(strings[uVar15 + 1],depth);
    uVar6 = get_char<unsigned_short>(strings[uVar15 + 3],depth);
    uVar7 = get_char<unsigned_short>(strings[uVar15 + 5],depth);
    uVar8 = get_char<unsigned_short>(strings[uVar15 + 7],depth);
    uVar9 = get_char<unsigned_short>(strings[uVar15 + 9],depth);
    uVar10 = get_char<unsigned_short>(strings[uVar15 + 0xb],depth);
    uVar11 = get_char<unsigned_short>(strings[uVar15 + 0xd],depth);
    uVar12 = get_char<unsigned_short>(strings[uVar15 + 0xf],depth);
    auVar22._0_2_ = -(ushort)(((ushort)local_98 ^ 0x8000) == local_48);
    auVar22._2_2_ = -(ushort)((local_98._2_2_ ^ 0x8000) == uStack_46);
    auVar22._4_2_ = -(ushort)((local_98._4_2_ ^ 0x8000) == uStack_44);
    auVar22._6_2_ = -(ushort)((local_98._6_2_ ^ 0x8000) == uStack_42);
    auVar22._8_2_ = -(ushort)(((ushort)uStack_90 ^ 0x8000) == uStack_40);
    auVar22._10_2_ = -(ushort)((uStack_90._2_2_ ^ 0x8000) == uStack_3e);
    auVar22._12_2_ = -(ushort)((uStack_90._4_2_ ^ 0x8000) == uStack_3c);
    auVar22._14_2_ = -(ushort)((uStack_90._6_2_ ^ 0x8000) == uStack_3a);
    auVar24._0_2_ = -(ushort)((short)local_48 < (short)((ushort)local_98 ^ 0x8000));
    auVar24._2_2_ = -(ushort)((short)uStack_46 < (short)(local_98._2_2_ ^ 0x8000));
    auVar24._4_2_ = -(ushort)((short)uStack_44 < (short)(local_98._4_2_ ^ 0x8000));
    auVar24._6_2_ = -(ushort)((short)uStack_42 < (short)(local_98._6_2_ ^ 0x8000));
    auVar24._8_2_ = -(ushort)((short)uStack_40 < (short)((ushort)uStack_90 ^ 0x8000));
    auVar24._10_2_ = -(ushort)((short)uStack_3e < (short)(uStack_90._2_2_ ^ 0x8000));
    auVar24._12_2_ = -(ushort)((short)uStack_3c < (short)(uStack_90._4_2_ ^ 0x8000));
    auVar24._14_2_ = -(ushort)((short)uStack_3a < (short)(uStack_90._6_2_ ^ 0x8000));
    auVar23._0_2_ = -(ushort)((uVar5 ^ 0x8000) == local_48);
    auVar23._2_2_ = -(ushort)((uVar6 ^ 0x8000) == uStack_46);
    auVar23._4_2_ = -(ushort)((uVar7 ^ 0x8000) == uStack_44);
    auVar23._6_2_ = -(ushort)((uVar8 ^ 0x8000) == uStack_42);
    auVar23._8_2_ = -(ushort)((uVar9 ^ 0x8000) == uStack_40);
    auVar23._10_2_ = -(ushort)((uVar10 ^ 0x8000) == uStack_3e);
    auVar23._12_2_ = -(ushort)((uVar11 ^ 0x8000) == uStack_3c);
    auVar23._14_2_ = -(ushort)((uVar12 ^ 0x8000) == uStack_3a);
    auVar17._0_2_ = -(ushort)((short)local_48 < (short)(uVar5 ^ 0x8000));
    auVar17._2_2_ = -(ushort)((short)uStack_46 < (short)(uVar6 ^ 0x8000));
    auVar17._4_2_ = -(ushort)((short)uStack_44 < (short)(uVar7 ^ 0x8000));
    auVar17._6_2_ = -(ushort)((short)uStack_42 < (short)(uVar8 ^ 0x8000));
    auVar17._8_2_ = -(ushort)((short)uStack_40 < (short)(uVar9 ^ 0x8000));
    auVar17._10_2_ = -(ushort)((short)uStack_3e < (short)(uVar10 ^ 0x8000));
    auVar17._12_2_ = -(ushort)((short)uStack_3c < (short)(uVar11 ^ 0x8000));
    auVar17._14_2_ = -(ushort)((short)uStack_3a < (short)(uVar12 ^ 0x8000));
    auVar17 = auVar17 & _DAT_00235fa0 | auVar23 & _DAT_00235f90;
    auVar18._0_8_ = auVar17._0_8_ << 8;
    auVar18._8_8_ = auVar17._8_8_ << 8;
    *(undefined1 (*) [16])(local_50 + uVar15) =
         auVar18 | auVar24 & _DAT_00235fa0 | auVar22 & _DAT_00235f90;
  }
  for (; uVar14 < sVar3; uVar14 = uVar14 + 1) {
    uVar5 = get_char<unsigned_short>(strings[uVar14],depth);
    oracle_00[uVar14] = (uVar4 <= uVar5 && uVar5 != uVar4) * '\x02' | uVar5 == uVar4;
  }
  for (uVar15 = 0; N_00 = local_b0._M_elems[0], sVar3 != uVar15; uVar15 = uVar15 + 1) {
    local_b0._M_elems[oracle_00[uVar15]] = local_b0._M_elems[oracle_00[uVar15]] + 1;
  }
  if (local_b0._M_elems[2] + local_b0._M_elems[1] + local_b0._M_elems[0] != sVar3) {
    __assert_fail("bucketsize[0] + bucketsize[1] + bucketsize[2] == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_simd.cpp"
                  ,0x166,
                  "void multikey_simd_b(unsigned char **, size_t, size_t, unsigned char **__restrict, uint8_t *__restrict) [CharT = unsigned short]"
                 );
  }
  local_88 = 0;
  local_80 = local_b0._M_elems[0];
  local_78 = local_b0._M_elems[1] + local_b0._M_elems[0];
  for (uVar15 = 0; sVar3 != uVar15; uVar15 = uVar15 + 1) {
    puVar1 = strings[uVar15];
    vVar2 = (&local_88)[oracle_00[uVar15]];
    (&local_88)[oracle_00[uVar15]] = vVar2 + 1;
    sorted_00[vVar2] = puVar1;
  }
  memcpy(strings,sorted_00,sVar3 << 3);
  multikey_simd_b<unsigned_short>(strings,N_00,depth,sorted_00,oracle_00);
  local_b8 = (char)uVar4;
  if (local_b8 != '\0') {
    multikey_simd_b<unsigned_short>
              (strings + local_b0._M_elems[0],local_b0._M_elems[1],depth + 2,sorted_00,oracle_00);
  }
  multikey_simd_b<unsigned_short>
            (strings + local_b0._M_elems[0] + local_b0._M_elems[1],local_b0._M_elems[2],depth,
             sorted_00,oracle_00);
  return;
}

Assistant:

static void
multikey_simd_b(unsigned char** strings, size_t N, size_t depth,
		unsigned char** restrict sorted, uint8_t* restrict oracle)
{
	if (N < 32) {
		insertion_sort(strings, N, depth);
		return;
	}
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	size_t i=N-N%16;
	calculate_bucketsizes_sse<true>(strings, i, oracle, partval, depth);
	for (; i < N; ++i)
		oracle[i] = get_bucket(
				get_char<CharT>(strings[i], depth),
				partval);
	for (i=0; i < N; ++i) {
		__builtin_prefetch(&oracle[i+1]);
		++bucketsize[oracle[i]];
	}
	assert(bucketsize[0] + bucketsize[1] + bucketsize[2] == N);
	size_t bucketindex[3];
	bucketindex[0] = 0;
	bucketindex[1] = bucketsize[0];
	bucketindex[2] = bucketsize[0] + bucketsize[1];
	for (size_t i=0; i < N; ++i) {
		__builtin_prefetch(&oracle[i+1]);
		sorted[bucketindex[oracle[i]]++] = strings[i];
	}
	std::copy(sorted, sorted+N, strings);
	multikey_simd_b<CharT>(strings, bucketsize[0], depth,
			sorted, oracle);
	if (not is_end(partval))
		multikey_simd_b<CharT>(strings+bucketsize[0],
				bucketsize[1], depth+sizeof(CharT),
				sorted, oracle);
	multikey_simd_b<CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth, sorted, oracle);
}